

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btPolyhedralContactClipping.cpp
# Opt level: O0

void btPolyhedralContactClipping::clipFaceAgainstHull
               (btVector3 *separatingNormal,btConvexPolyhedron *hullA,btTransform *transA,
               btVertexArray *worldVertsB1,btScalar minDist,btScalar maxDist,Result *resultOut)

{
  undefined1 auVar1 [16];
  int iVar2;
  btFace *pbVar3;
  btFace *pbVar4;
  btFace *pbVar5;
  btAlignedObjectArray<btVector3> *pbVar6;
  int *piVar7;
  btVector3 *pbVar8;
  btAlignedObjectArray<btVector3> *in_RCX;
  btTransform *in_RDX;
  long in_RSI;
  btVector3 *in_RDI;
  long *in_R8;
  float in_XMM0_Da;
  btScalar bVar9;
  btScalar bVar10;
  btVertexArray *ppVtxOut;
  undefined8 extraout_XMM0_Qb;
  btVertexArray *extraout_XMM0_Qb_00;
  float in_XMM1_Da;
  btVector3 bVar11;
  btVector3 point_1;
  btScalar depth;
  btVector3 vtx;
  int i;
  btScalar planeEqWS_1;
  btVector3 planeNormalWS_1;
  btScalar localPlaneEq;
  btVector3 localPlaneNormal;
  btVector3 point;
  btScalar planeEqWS;
  btVector3 planeNormalWS;
  btScalar planeEqWS1;
  btVector3 worldA1;
  btVector3 planeNormalWS1;
  btVector3 worldPlaneAnormal1;
  btVector3 WorldEdge0;
  btVector3 edge0;
  btVector3 *b;
  btVector3 *a;
  int e0;
  int numVerticesA;
  btFace *polyA;
  btScalar d;
  btVector3 faceANormalWS;
  btVector3 Normal;
  int face;
  btScalar dmin;
  int closestFaceA;
  btVertexArray *pVtxOut;
  btVertexArray *pVtxIn;
  btVertexArray worldVertsB2;
  btVector3 *in_stack_fffffffffffffc28;
  undefined4 in_stack_fffffffffffffc30;
  undefined4 in_stack_fffffffffffffc34;
  btVector3 *in_stack_fffffffffffffc38;
  undefined4 in_stack_fffffffffffffc40;
  int iVar12;
  undefined4 in_stack_fffffffffffffc44;
  int in_stack_fffffffffffffc4c;
  btAlignedObjectArray<btVector3> *in_stack_fffffffffffffc50;
  undefined1 auVar13 [12];
  btVertexArray *pVtxIn_00;
  btScalar local_338;
  btScalar bStack_334;
  undefined4 uStack_330;
  undefined4 uStack_32c;
  btScalar local_318;
  btScalar bStack_314;
  btScalar local_2f8;
  btScalar bStack_2f4;
  btScalar local_2c8;
  btScalar bStack_2c4;
  btScalar local_298;
  btScalar bStack_294;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  float local_1ac;
  btVector3 local_1a8;
  int local_198;
  float local_194;
  btVector3 local_190;
  btScalar local_180;
  btVector3 local_17c;
  btVector3 local_16c;
  btVector3 local_15c;
  btScalar local_14c;
  undefined8 local_148;
  btScalar abStack_140 [3];
  btScalar local_134;
  btVertexArray *local_130;
  btScalar local_128 [2];
  btScalar local_120;
  btScalar bStack_11c;
  undefined8 local_118;
  btVector3 local_110;
  btVector3 local_100;
  btScalar local_f0;
  btScalar bStack_ec;
  undefined8 local_e8;
  btScalar local_e0;
  btScalar bStack_dc;
  undefined8 local_d8;
  btScalar local_d0;
  btScalar bStack_cc;
  undefined8 local_c8;
  btVector3 *local_c0;
  btVector3 *local_b8;
  int local_b0;
  int local_ac;
  btFace *local_a8;
  undefined4 local_a0;
  btScalar local_9c;
  btVector3 local_98;
  btVector3 local_88;
  int local_78;
  btScalar local_74;
  int local_70;
  btAlignedObjectArray<btVector3> *local_60;
  btAlignedObjectArray<btVector3> *local_58;
  btAlignedObjectArray<btVector3> local_50;
  long *local_30;
  float local_28;
  float local_24;
  btAlignedObjectArray<btVector3> *local_20;
  btTransform *local_18;
  long local_10;
  btVector3 *local_8;
  
  local_30 = in_R8;
  local_28 = in_XMM1_Da;
  local_24 = in_XMM0_Da;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  btAlignedObjectArray<btVector3>::btAlignedObjectArray
            ((btAlignedObjectArray<btVector3> *)
             CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
  local_58 = local_20;
  local_60 = &local_50;
  btAlignedObjectArray<btVector3>::size(local_20);
  btAlignedObjectArray<btVector3>::reserve
            ((btAlignedObjectArray<btVector3> *)
             CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
             (int)((ulong)in_stack_fffffffffffffc38 >> 0x20));
  local_70 = -1;
  local_74 = 3.4028235e+38;
  local_78 = 0;
  while( true ) {
    iVar12 = local_78;
    iVar2 = btAlignedObjectArray<btFace>::size((btAlignedObjectArray<btFace> *)(local_10 + 0x28));
    if (iVar2 <= iVar12) break;
    pbVar3 = btAlignedObjectArray<btFace>::operator[]
                       ((btAlignedObjectArray<btFace> *)(local_10 + 0x28),local_78);
    pbVar4 = btAlignedObjectArray<btFace>::operator[]
                       ((btAlignedObjectArray<btFace> *)(local_10 + 0x28),local_78);
    pbVar5 = btAlignedObjectArray<btFace>::operator[]
                       ((btAlignedObjectArray<btFace> *)(local_10 + 0x28),local_78);
    btVector3::btVector3(&local_88,pbVar3->m_plane,pbVar4->m_plane + 1,pbVar5->m_plane + 2);
    btTransform::getBasis(local_18);
    bVar11 = ::operator*((btMatrix3x3 *)
                         CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                         in_stack_fffffffffffffc38);
    local_98.m_floats._0_8_ = bVar11.m_floats._0_8_;
    local_98.m_floats._8_8_ = bVar11.m_floats._8_8_;
    local_9c = btVector3::dot(&local_98,local_8);
    if (local_9c < local_74) {
      local_70 = local_78;
      local_74 = local_9c;
    }
    local_78 = local_78 + 1;
  }
  if (local_70 < 0) {
    local_a0 = 1;
  }
  else {
    local_a8 = btAlignedObjectArray<btFace>::operator[]
                         ((btAlignedObjectArray<btFace> *)(local_10 + 0x28),local_70);
    local_ac = btAlignedObjectArray<int>::size(&local_a8->m_indices);
    for (local_b0 = 0; local_b0 < local_ac; local_b0 = local_b0 + 1) {
      pbVar6 = (btAlignedObjectArray<btVector3> *)(local_10 + 8);
      piVar7 = btAlignedObjectArray<int>::operator[](&local_a8->m_indices,local_b0);
      local_b8 = btAlignedObjectArray<btVector3>::operator[](pbVar6,*piVar7);
      pbVar6 = (btAlignedObjectArray<btVector3> *)(local_10 + 8);
      piVar7 = btAlignedObjectArray<int>::operator[](&local_a8->m_indices,(local_b0 + 1) % local_ac)
      ;
      local_c0 = btAlignedObjectArray<btVector3>::operator[](pbVar6,*piVar7);
      bVar11 = operator-((btVector3 *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                         in_stack_fffffffffffffc38);
      local_c8 = bVar11.m_floats._8_8_;
      local_298 = bVar11.m_floats[0];
      bStack_294 = bVar11.m_floats[1];
      local_d0 = local_298;
      bStack_cc = bStack_294;
      btTransform::getBasis(local_18);
      bVar11 = ::operator*((btMatrix3x3 *)
                           CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                           in_stack_fffffffffffffc38);
      local_d8 = bVar11.m_floats._8_8_;
      local_2c8 = bVar11.m_floats[0];
      bStack_2c4 = bVar11.m_floats[1];
      local_e0 = local_2c8;
      bStack_dc = bStack_2c4;
      btTransform::getBasis(local_18);
      btVector3::btVector3(&local_100,local_a8->m_plane,local_a8->m_plane + 1,local_a8->m_plane + 2)
      ;
      bVar11 = ::operator*((btMatrix3x3 *)
                           CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                           in_stack_fffffffffffffc38);
      local_e8 = bVar11.m_floats._8_8_;
      local_2f8 = bVar11.m_floats[0];
      bStack_2f4 = bVar11.m_floats[1];
      local_f0 = local_2f8;
      bStack_ec = bStack_2f4;
      bVar11 = btVector3::cross((btVector3 *)
                                CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                                in_stack_fffffffffffffc38);
      local_118 = bVar11.m_floats._8_8_;
      local_318 = bVar11.m_floats[0];
      bStack_314 = bVar11.m_floats[1];
      local_120 = local_318;
      bStack_11c = bStack_314;
      bVar11 = operator-((btVector3 *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30))
      ;
      local_110.m_floats._8_8_ = bVar11.m_floats._8_8_;
      local_338 = bVar11.m_floats[0];
      bStack_334 = bVar11.m_floats[1];
      uStack_330 = (undefined4)extraout_XMM0_Qb;
      uStack_32c = (undefined4)((ulong)extraout_XMM0_Qb >> 0x20);
      local_110.m_floats[0] = local_338;
      local_110.m_floats[1] = bStack_334;
      bVar11 = btTransform::operator*
                         ((btTransform *)
                          CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                          in_stack_fffffffffffffc28);
      ppVtxOut = bVar11.m_floats._0_8_;
      local_128 = bVar11.m_floats._8_8_;
      auVar1._8_4_ = uStack_330;
      auVar1._0_4_ = local_128[0];
      auVar1._4_4_ = local_128[1];
      auVar1._12_4_ = uStack_32c;
      auVar13 = auVar1._4_12_;
      pVtxIn_00 = extraout_XMM0_Qb_00;
      local_130 = ppVtxOut;
      local_14c = btVector3::dot((btVector3 *)&local_130,&local_110);
      local_14c = -local_14c;
      local_148 = CONCAT44(local_110.m_floats[1],local_110.m_floats[0]);
      abStack_140[0] = local_110.m_floats[2];
      abStack_140[1] = local_110.m_floats[3];
      local_134 = local_14c;
      clipFace(pVtxIn_00,ppVtxOut,auVar13._4_8_,auVar13._0_4_);
      btSwap<btAlignedObjectArray<btVector3>*>(&local_58,&local_60);
      btVector3::btVector3(&local_15c);
      btAlignedObjectArray<btVector3>::resize
                (in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,
                 (btVector3 *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40));
    }
    btVector3::btVector3(&local_16c);
    btVector3::btVector3(&local_17c,local_a8->m_plane,local_a8->m_plane + 1,local_a8->m_plane + 2);
    local_180 = local_a8->m_plane[3];
    btTransform::getBasis(local_18);
    bVar11 = ::operator*((btMatrix3x3 *)
                         CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                         in_stack_fffffffffffffc38);
    local_190.m_floats._0_8_ = bVar11.m_floats._0_8_;
    local_190.m_floats._8_8_ = bVar11.m_floats._8_8_;
    bVar10 = local_180;
    pbVar8 = btTransform::getOrigin(local_18);
    bVar9 = btVector3::dot(&local_190,pbVar8);
    local_194 = bVar10 - bVar9;
    local_198 = 0;
    while( true ) {
      iVar12 = local_198;
      iVar2 = btAlignedObjectArray<btVector3>::size(local_58);
      if (iVar2 <= iVar12) break;
      pbVar8 = btAlignedObjectArray<btVector3>::at(local_58,local_198);
      local_1a8.m_floats._0_8_ = *(undefined8 *)pbVar8->m_floats;
      local_1a8.m_floats._8_8_ = *(undefined8 *)(pbVar8->m_floats + 2);
      bVar10 = btVector3::dot(&local_190,&local_1a8);
      local_1ac = bVar10 + local_194;
      if (local_1ac <= local_24) {
        local_1ac = local_24;
      }
      if (local_1ac <= local_28) {
        pbVar8 = btAlignedObjectArray<btVector3>::at(local_58,local_198);
        local_1c8 = *(undefined8 *)pbVar8->m_floats;
        uStack_1c0 = *(undefined8 *)(pbVar8->m_floats + 2);
        (**(code **)(*local_30 + 0x20))(local_30,local_8,&local_1c8);
      }
      local_198 = local_198 + 1;
    }
    local_a0 = 0;
  }
  btAlignedObjectArray<btVector3>::~btAlignedObjectArray
            ((btAlignedObjectArray<btVector3> *)0x1f38ef);
  return;
}

Assistant:

void	btPolyhedralContactClipping::clipFaceAgainstHull(const btVector3& separatingNormal, const btConvexPolyhedron& hullA,  const btTransform& transA, btVertexArray& worldVertsB1, const btScalar minDist, btScalar maxDist,btDiscreteCollisionDetectorInterface::Result& resultOut)
{
	btVertexArray worldVertsB2;
	btVertexArray* pVtxIn = &worldVertsB1;
	btVertexArray* pVtxOut = &worldVertsB2;
	pVtxOut->reserve(pVtxIn->size());

	int closestFaceA=-1;
	{
		btScalar dmin = FLT_MAX;
		for(int face=0;face<hullA.m_faces.size();face++)
		{
			const btVector3 Normal(hullA.m_faces[face].m_plane[0], hullA.m_faces[face].m_plane[1], hullA.m_faces[face].m_plane[2]);
			const btVector3 faceANormalWS = transA.getBasis() * Normal;
		
			btScalar d = faceANormalWS.dot(separatingNormal);
			if (d < dmin)
			{
				dmin = d;
				closestFaceA = face;
			}
		}
	}
	if (closestFaceA<0)
		return;

	const btFace& polyA = hullA.m_faces[closestFaceA];

		// clip polygon to back of planes of all faces of hull A that are adjacent to witness face
	int numVerticesA = polyA.m_indices.size();
	for(int e0=0;e0<numVerticesA;e0++)
	{
		const btVector3& a = hullA.m_vertices[polyA.m_indices[e0]];
		const btVector3& b = hullA.m_vertices[polyA.m_indices[(e0+1)%numVerticesA]];
		const btVector3 edge0 = a - b;
		const btVector3 WorldEdge0 = transA.getBasis() * edge0;
		btVector3 worldPlaneAnormal1 = transA.getBasis()* btVector3(polyA.m_plane[0],polyA.m_plane[1],polyA.m_plane[2]);

		btVector3 planeNormalWS1 = -WorldEdge0.cross(worldPlaneAnormal1);//.cross(WorldEdge0);
		btVector3 worldA1 = transA*a;
		btScalar planeEqWS1 = -worldA1.dot(planeNormalWS1);
		
//int otherFace=0;
#ifdef BLA1
		int otherFace = polyA.m_connectedFaces[e0];
		btVector3 localPlaneNormal (hullA.m_faces[otherFace].m_plane[0],hullA.m_faces[otherFace].m_plane[1],hullA.m_faces[otherFace].m_plane[2]);
		btScalar localPlaneEq = hullA.m_faces[otherFace].m_plane[3];

		btVector3 planeNormalWS = transA.getBasis()*localPlaneNormal;
		btScalar planeEqWS=localPlaneEq-planeNormalWS.dot(transA.getOrigin());
#else 
		btVector3 planeNormalWS = planeNormalWS1;
		btScalar planeEqWS=planeEqWS1;
		
#endif
		//clip face

		clipFace(*pVtxIn, *pVtxOut,planeNormalWS,planeEqWS);
		btSwap(pVtxIn,pVtxOut);
		pVtxOut->resize(0);
	}



//#define ONLY_REPORT_DEEPEST_POINT

	btVector3 point;
	

	// only keep points that are behind the witness face
	{
		btVector3 localPlaneNormal (polyA.m_plane[0],polyA.m_plane[1],polyA.m_plane[2]);
		btScalar localPlaneEq = polyA.m_plane[3];
		btVector3 planeNormalWS = transA.getBasis()*localPlaneNormal;
		btScalar planeEqWS=localPlaneEq-planeNormalWS.dot(transA.getOrigin());
		for (int i=0;i<pVtxIn->size();i++)
		{
			btVector3 vtx = pVtxIn->at(i);
			btScalar depth = planeNormalWS.dot(vtx)+planeEqWS;
			if (depth <=minDist)
			{
//				printf("clamped: depth=%f to minDist=%f\n",depth,minDist);
				depth = minDist;
			}

			if (depth <=maxDist)
			{
				btVector3 point = pVtxIn->at(i);
#ifdef ONLY_REPORT_DEEPEST_POINT
				curMaxDist = depth;
#else
#if 0
				if (depth<-3)
				{
					printf("error in btPolyhedralContactClipping depth = %f\n", depth);
					printf("likely wrong separatingNormal passed in\n");
				} 
#endif				
				resultOut.addContactPoint(separatingNormal,point,depth);
#endif
			}
		}
	}
#ifdef ONLY_REPORT_DEEPEST_POINT
	if (curMaxDist<maxDist)
	{
		resultOut.addContactPoint(separatingNormal,point,curMaxDist);
	}
#endif //ONLY_REPORT_DEEPEST_POINT

}